

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O2

FailStep run(string *str)

{
  bool bVar1;
  ostream *poVar2;
  FailStep FVar3;
  undefined1 local_78 [8];
  optional<std::shared_ptr<ScriptAstNode>_> script;
  shared_ptr<StringReader> reader;
  shared_ptr<Tokenizer> tokenizer;
  shared_ptr<TokenBuffer> tokenBuffer;
  shared_ptr<Parser> parser;
  shared_ptr<SemanticAnalyzer> analyzer;
  
  std::make_shared<StringReader,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged);
  std::make_shared<Tokenizer,std::shared_ptr<StringReader>&>
            ((shared_ptr<StringReader> *)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<TokenBuffer,std::shared_ptr<Tokenizer>&>
            ((shared_ptr<Tokenizer> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<Parser,std::shared_ptr<TokenBuffer>&,std::ostream&>
            ((shared_ptr<TokenBuffer> *)
             &tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (basic_ostream<char,_std::char_traits<char>_> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Parser::parseScript((optional<std::shared_ptr<ScriptAstNode>_> *)local_78,
                      (Parser *)
                      tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  if (script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failure during parsing!");
    std::endl<char,std::char_traits<char>>(poVar2);
    FVar3 = Parsing;
  }
  else {
    std::make_shared<SemanticAnalyzer,std::ostream&,std::shared_ptr<StringReader>&>
              ((basic_ostream<char,_std::char_traits<char>_> *)
               &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<StringReader> *)&std::cout);
    if (script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ == '\0') {
      std::__throw_bad_optional_access();
    }
    bVar1 = SemanticAnalyzer::isValid
                      ((SemanticAnalyzer *)
                       parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi,(shared_ptr<ScriptAstNode> *)local_78);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No Failure!");
      FVar3 = None;
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failure during semantic analysis!");
      std::endl<char,std::char_traits<char>>(poVar2);
      FVar3 = SemanticAnalysis;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&analyzer);
  }
  std::_Optional_payload_base<std::shared_ptr<ScriptAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ScriptAstNode>_> *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parser);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tokenBuffer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tokenizer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader);
  return FVar3;
}

Assistant:

FailStep run(const std::string & str) {

  auto reader = std::make_shared<StringReader>(str);
  auto tokenizer = std::make_shared<Tokenizer>(reader);
  auto tokenBuffer = std::make_shared<TokenBuffer>(tokenizer);
  auto parser = std::make_shared<Parser>(tokenBuffer, std::cout);

  auto script = parser->parseScript();

  if (!script) {
    std::cerr << "Failure during parsing!" << std::endl;
    return FailStep::Parsing;
  }

  auto analyzer = std::make_shared<SemanticAnalyzer>(std::cout, reader);

  if (!analyzer->isValid(script.value())) {
    std::cerr << "Failure during semantic analysis!" << std::endl;
    return FailStep::SemanticAnalysis;
  }

  std::cout << "No Failure!" << std::endl;

  return FailStep::None;
}